

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O3

void __thiscall
GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
          (GenericFunctionInstanceTypeRequest *this,TypeBase *parentType,FunctionData *function,
          IntrusiveList<TypeHandle> arguments,IntrusiveList<MatchData> aliases)

{
  TypeBase **ppTVar1;
  int iVar2;
  uint uVar3;
  TypeHandle *pTVar4;
  
  pTVar4 = arguments.head;
  this->parentType = parentType;
  this->function = function;
  (this->arguments).head = pTVar4;
  (this->arguments).tail = arguments.tail;
  (this->aliases).head = aliases.head;
  (this->aliases).tail = aliases.tail;
  if (parentType == (TypeBase *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = parentType->nameHash * 0x21;
  }
  uVar3 = iVar2 + function->nameHash;
  this->hash = uVar3;
  if (pTVar4 != (TypeHandle *)0x0) {
    do {
      ppTVar1 = &pTVar4->type;
      pTVar4 = pTVar4->next;
      uVar3 = uVar3 * 0x21 + (*ppTVar1)->nameHash;
    } while (pTVar4 != (TypeHandle *)0x0);
    this->hash = uVar3;
  }
  if (aliases.head != (MatchData *)0x0) {
    do {
      ppTVar1 = &(aliases.head)->type;
      aliases.head = (aliases.head)->next;
      uVar3 = uVar3 * 0x21 + (*ppTVar1)->nameHash;
    } while (aliases.head != (MatchData *)0x0);
    this->hash = uVar3;
  }
  return;
}

Assistant:

GenericFunctionInstanceTypeRequest(TypeBase *parentType, FunctionData *function, IntrusiveList<TypeHandle> arguments, IntrusiveList<MatchData> aliases): parentType(parentType), function(function), arguments(arguments), aliases(aliases)
	{
		hash = parentType ? parentType->nameHash : 0;

		hash = hash + (hash << 5) + function->nameHash;

		for(TypeHandle *curr = arguments.head; curr; curr = curr->next)
			hash = hash + (hash << 5) + curr->type->nameHash;

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
			hash = hash + (hash << 5) + curr->type->nameHash;
	}